

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiWindow *pIVar1;
  ImGuiNavLayer in_EDI;
  ImGuiContext *g;
  undefined4 in_stack_00000010;
  ImGuiWindow *in_stack_ffffffffffffffe8;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  GImGui->NavLayer = in_EDI;
  if (in_EDI == ImGuiNavLayer_Main) {
    pIVar1 = ImGui::NavRestoreLastChildNavWindow(in_stack_ffffffffffffffe8);
    pIVar2->NavWindow = pIVar1;
  }
  if (pIVar2->NavWindow->NavLastIds[in_EDI] == 0) {
    ImGui::NavInitWindow((ImGuiWindow *)CONCAT44(layer,in_stack_00000010),g._7_1_);
  }
  else {
    ImGui::SetNavIDWithRectRel
              ((ImGuiID)((ulong)pIVar2 >> 0x20),(int)pIVar2,(ImRect *)in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    if (g.NavWindow->NavLastIds[layer] != 0)
        ImGui::SetNavIDWithRectRel(g.NavWindow->NavLastIds[layer], layer, g.NavWindow->NavRectRel[layer]);
    else
        ImGui::NavInitWindow(g.NavWindow, true);
}